

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSaveFileButton.cpp
# Opt level: O1

void QSaveFileButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *filter;
  Int *pIVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QString *pQVar4;
  Options OVar5;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 0) {
      local_48.ptr = (QString *)_a[1];
      local_48.d = (Data *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48.d);
    }
    break;
  case ReadProperty:
    if (4 < (uint)_id) {
      return;
    }
    pIVar1 = (Int *)*_a;
    switch(_id) {
    case 0:
      filePath((QString *)&local_48,(QSaveFileButton *)_o);
      break;
    case 1:
      caption((QString *)&local_48,(QSaveFileButton *)_o);
      break;
    case 2:
      directory((QString *)&local_48,(QSaveFileButton *)_o);
      break;
    case 3:
      QSaveFileButton::filter((QStringList *)&local_28,(QSaveFileButton *)_o);
      qVar2 = local_28.size;
      pQVar4 = local_28.ptr;
      pDVar3 = local_28.d;
      local_28.d = (Data *)0x0;
      local_28.ptr = (QString *)0x0;
      local_28.size = 0;
      local_48.d = *(Data **)pIVar1;
      local_48.ptr = *(QString **)(pIVar1 + 2);
      *(Data **)pIVar1 = pDVar3;
      *(QString **)(pIVar1 + 2) = pQVar4;
      local_48.size = *(qsizetype *)(pIVar1 + 4);
      *(qsizetype *)(pIVar1 + 4) = qVar2;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 4:
      OVar5 = options((QSaveFileButton *)_o);
      *pIVar1 = OVar5.i;
      return;
    }
    pDVar3 = *(Data **)pIVar1;
    pQVar4 = *(QString **)(pIVar1 + 2);
    *(Data **)pIVar1 = local_48.d;
    *(QString **)(pIVar1 + 2) = local_48.ptr;
    qVar2 = *(qsizetype *)(pIVar1 + 4);
    *(qsizetype *)(pIVar1 + 4) = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pQVar4;
    local_48.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      filter = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setFilePath((QSaveFileButton *)_o,(QString *)filter);
        return;
      case 1:
        setCaption((QSaveFileButton *)_o,(QString *)filter);
        return;
      case 2:
        setDirectory((QSaveFileButton *)_o,(QString *)filter);
        return;
      case 3:
        setFilter((QSaveFileButton *)_o,filter);
        return;
      case 4:
        setOptions((QSaveFileButton *)_o,(Options)*(Int *)&(filter->d).d);
        return;
      }
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == filePathChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QSaveFileButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QSaveFileButton::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSaveFileButton::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 3: *reinterpret_cast< QStringList*>(_v) = _t->filter(); break;
        case 4: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setFilter(*reinterpret_cast< QStringList*>(_v)); break;
        case 4: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}